

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O0

_Bool ts_are_copies(TCGTemp *ts1,TCGTemp *ts2)

{
  _Bool _Var1;
  tcg_temp_info *ptVar2;
  TCGTemp *local_28;
  TCGTemp *i;
  TCGTemp *ts2_local;
  TCGTemp *ts1_local;
  
  if (ts1 == ts2) {
    ts1_local._7_1_ = true;
  }
  else {
    _Var1 = ts_is_copy(ts1);
    if ((_Var1) && (_Var1 = ts_is_copy(ts2), _Var1)) {
      ptVar2 = ts_info(ts1);
      local_28 = ptVar2->next_copy;
      while (local_28 != ts1) {
        if (local_28 == ts2) {
          return true;
        }
        ptVar2 = ts_info(local_28);
        local_28 = ptVar2->next_copy;
      }
      ts1_local._7_1_ = false;
    }
    else {
      ts1_local._7_1_ = false;
    }
  }
  return ts1_local._7_1_;
}

Assistant:

static bool ts_are_copies(TCGTemp *ts1, TCGTemp *ts2)
{
    TCGTemp *i;

    if (ts1 == ts2) {
        return true;
    }

    if (!ts_is_copy(ts1) || !ts_is_copy(ts2)) {
        return false;
    }

    for (i = ts_info(ts1)->next_copy; i != ts1; i = ts_info(i)->next_copy) {
        if (i == ts2) {
            return true;
        }
    }

    return false;
}